

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O1

trie_node trie_node_find(trie t,trie_key key)

{
  trie_node ptVar1;
  bool bVar2;
  int iVar3;
  vector v;
  size_t sVar4;
  long *plVar5;
  set_value pvVar6;
  trie_node back;
  set_iterator it;
  trie_node current_node;
  set_iterator local_50;
  trie_node local_48;
  trie_key local_40;
  trie_node local_38;
  
  local_40 = key;
  v = vector_create(8);
  vector_push_back(v,t);
  do {
    sVar4 = vector_size(v);
    if (sVar4 == 0) {
      vector_destroy(v);
      return (trie_node)0x0;
    }
    plVar5 = (long *)vector_back(v);
    vector_pop_back(v);
    bVar2 = true;
    if ((plVar5 != (long *)0x0) && (ptVar1 = (trie_node)*plVar5, ptVar1 != (trie_node)0x0)) {
      local_50 = (set_iterator)0x0;
      if (ptVar1->childs != (set)0x0) {
        local_50 = set_iterator_begin(ptVar1->childs);
        while (iVar3 = set_iterator_end(&local_50), 0 < iVar3) {
          pvVar6 = set_iterator_get_value(local_50);
          local_38 = t->node_list + *(long *)((long)pvVar6 + 8);
          vector_push_back(v,&local_38);
          set_iterator_next(local_50);
        }
      }
      bVar2 = true;
      if ((ptVar1->key != (comparable)0x0) &&
         (iVar3 = (*t->compare_cb)(ptVar1->key,local_40), iVar3 == 0)) {
        while (iVar3 = set_iterator_end(&local_50), 0 < iVar3) {
          set_iterator_next(local_50);
        }
        vector_destroy(v);
        bVar2 = false;
        local_48 = ptVar1;
      }
    }
  } while (bVar2);
  return local_48;
}

Assistant:

trie_node trie_node_find(trie t, trie_key key)
{
	if (t != NULL && key != NULL)
	{
		vector node_stack = vector_create(sizeof(trie_node));

		vector_push_back(node_stack, &t->root);

		while (vector_size(node_stack) > 0)
		{
			trie_node *back_ptr = vector_back(node_stack);

			vector_pop_back(node_stack);

			if (back_ptr != NULL && *back_ptr != NULL)
			{
				trie_node back = *back_ptr;

				set_iterator it = NULL;

				if (back->childs != NULL)
				{
					for (it = set_iterator_begin(back->childs); set_iterator_end(&it) > 0; set_iterator_next(it))
					{
						trie_node_ref ref_node = set_iterator_get_value(it);

						trie_node current_node = &t->node_list[ref_node->index];

						vector_push_back(node_stack, &current_node);
					}
				}

				if (back->key != NULL && t->compare_cb(back->key, key) == 0)
				{
					while (set_iterator_end(&it) > 0)
					{
						set_iterator_next(it);
					}

					vector_destroy(node_stack);

					return back;
				}
			}
		}

		vector_destroy(node_stack);
	}

	return NULL;
}